

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdEncodeBase58(void *handle,char *buffer,bool use_checksum,char **output)

{
  char *pcVar1;
  CfdException *pCVar2;
  ByteData *data_00;
  allocator local_61;
  string base58;
  ByteData data;
  
  cfd::Initialize();
  if (buffer == (char *)0x0) {
    base58._M_dataplus._M_p = "cfdcapi_common.cpp";
    base58._M_string_length._0_4_ = 0x369;
    base58.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_702d58;
    cfd::core::logger::warn<>((CfdSourceLocation *)&base58,"buffer is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&base58,"Failed to parameter. buffer is null.",(allocator *)&data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&base58);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (output != (char **)0x0) {
    std::__cxx11::string::string((string *)&base58,buffer,&local_61);
    cfd::core::ByteData::ByteData(&data,&base58);
    std::__cxx11::string::~string((string *)&base58);
    if (use_checksum) {
      cfd::core::CryptoUtil::EncodeBase58Check_abi_cxx11_
                ((string *)&base58,(CryptoUtil *)&data,data_00);
      pcVar1 = cfd::capi::CreateString(&base58);
    }
    else {
      cfd::core::CryptoUtil::EncodeBase58_abi_cxx11_((string *)&base58,(CryptoUtil *)&data,data_00);
      pcVar1 = cfd::capi::CreateString(&base58);
    }
    *output = pcVar1;
    std::__cxx11::string::~string((string *)&base58);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    return 0;
  }
  base58._M_dataplus._M_p = "cfdcapi_common.cpp";
  base58._M_string_length._0_4_ = 0x36f;
  base58.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_702d58;
  cfd::core::logger::warn<>((CfdSourceLocation *)&base58,"output is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&base58,"Failed to parameter. output is null.",(allocator *)&data);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&base58);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdEncodeBase58(
    void* handle, const char* buffer, bool use_checksum, char** output) {
  try {
    cfd::Initialize();
    if (buffer == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. buffer is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    ByteData data(buffer);
    if (use_checksum) {
      auto base58 = cfd::core::CryptoUtil::EncodeBase58Check(data);
      *output = cfd::capi::CreateString(base58);
    } else {
      auto base58 = cfd::core::CryptoUtil::EncodeBase58(data);
      *output = cfd::capi::CreateString(base58);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}